

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O2

yajl_gen_status yajl_gen_string(yajl_gen g,uchar *str,size_t len)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  int iVar3;
  yajl_gen_state yVar4;
  ulong uVar5;
  size_t sVar6;
  uint _i;
  uint uVar7;
  char *pcVar8;
  
  if (((g->flags & 8) != 0) && (iVar3 = yajl_string_validate_utf8(str,len), iVar3 == 0)) {
    return yajl_gen_invalid_string;
  }
  switch(g->state[g->depth]) {
  case yajl_gen_map_key:
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00104ef1_caseD_4;
    pcVar8 = "\n";
    break;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00104ef1_caseD_4;
    pcVar8 = " ";
    break;
  default:
    goto switchD_00104ef1_caseD_4;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar8,1);
switchD_00104ef1_caseD_4:
  if (((g->flags & 1) != 0) && (uVar5 = (ulong)g->depth, g->state[uVar5] != yajl_gen_map_val)) {
    for (uVar7 = 0; uVar7 < (uint)uVar5; uVar7 = uVar7 + 1) {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar8 = g->indentString;
      sVar6 = strlen(pcVar8);
      (*p_Var1)(pvVar2,pcVar8,sVar6 & 0xffffffff);
      uVar5 = (ulong)g->depth;
    }
  }
  (*g->print)(g->ctx,"\"",1);
  yajl_string_encode(g->print,g->ctx,str,len,g->flags & 0x10);
  (*g->print)(g->ctx,"\"",1);
  yVar4 = g->state[g->depth];
  if ((ulong)yVar4 < 5) {
    yVar4 = *(yajl_gen_state *)(&DAT_00107848 + (ulong)yVar4 * 4);
    g->state[g->depth] = yVar4;
  }
  if (((g->flags & 1) != 0) && (yVar4 == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_string(yajl_gen g, const unsigned char * str,
                size_t len)
{
    // if validation is enabled, check that the string is valid utf8
    // XXX: This checking could be done a little faster, in the same pass as
    // the string encoding
    if (g->flags & yajl_gen_validate_utf8) {
        if (!yajl_string_validate_utf8(str, len)) {
            return yajl_gen_invalid_string;
        }
    }
    ENSURE_VALID_STATE; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "\"", 1);
    yajl_string_encode(g->print, g->ctx, str, len, g->flags & yajl_gen_escape_solidus);
    g->print(g->ctx, "\"", 1);
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}